

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

QWidgetList * __thiscall
QAccessibleAbstractScrollArea::accessibleChildren(QAccessibleAbstractScrollArea *this)

{
  bool bVar1;
  AbstractScrollAreaElement AVar2;
  QWidget *pQVar3;
  QScrollBar *pQVar4;
  QAbstractScrollArea *in_RDI;
  QWidget *cornerWidget;
  QWidget *scrollBarParent_1;
  QScrollBar *verticalScrollBar;
  QWidget *scrollBarParent;
  QScrollBar *horizontalScrollBar;
  QWidget *viewport;
  QWidgetList *children;
  parameter_type in_stack_ffffffffffffff98;
  QAbstractScrollArea *this_00;
  QWidget *in_stack_ffffffffffffffc8;
  QWidget *in_stack_ffffffffffffffd0;
  
  *(Data **)&(in_RDI->super_QFrame).super_QWidget = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->super_QFrame).super_QWidget.field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->super_QFrame).super_QWidget.super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QWidget_*>::QList((QList<QWidget_*> *)0x7d5903);
  abstractScrollArea((QAccessibleAbstractScrollArea *)0x7d590d);
  pQVar3 = QAbstractScrollArea::viewport(this_00);
  if (pQVar3 != (QWidget *)0x0) {
    QList<QWidget_*>::append((QList<QWidget_*> *)0x7d5931,in_stack_ffffffffffffff98);
  }
  abstractScrollArea((QAccessibleAbstractScrollArea *)0x7d593b);
  pQVar4 = QAbstractScrollArea::horizontalScrollBar(this_00);
  if ((pQVar4 != (QScrollBar *)0x0) && (bVar1 = QWidget::isVisible((QWidget *)0x7d595a), bVar1)) {
    in_stack_ffffffffffffffd0 = QWidget::parentWidget((QWidget *)0x7d596a);
    AVar2 = elementType((QAccessibleAbstractScrollArea *)in_stack_ffffffffffffffd0,
                        in_stack_ffffffffffffffc8);
    if (AVar2 == HorizontalContainer) {
      QList<QWidget_*>::append((QList<QWidget_*> *)0x7d5992,in_stack_ffffffffffffff98);
    }
  }
  abstractScrollArea((QAccessibleAbstractScrollArea *)0x7d599e);
  pQVar3 = (QWidget *)QAbstractScrollArea::verticalScrollBar(this_00);
  if ((pQVar3 != (QWidget *)0x0) && (bVar1 = QWidget::isVisible((QWidget *)0x7d59bd), bVar1)) {
    QWidget::parentWidget((QWidget *)0x7d59cd);
    AVar2 = elementType((QAccessibleAbstractScrollArea *)in_stack_ffffffffffffffd0,pQVar3);
    if (AVar2 == VerticalContainer) {
      QList<QWidget_*>::append((QList<QWidget_*> *)0x7d59f5,in_stack_ffffffffffffff98);
    }
  }
  abstractScrollArea((QAccessibleAbstractScrollArea *)0x7d5a01);
  pQVar3 = QAbstractScrollArea::cornerWidget(this_00);
  if ((pQVar3 != (QWidget *)0x0) && (bVar1 = QWidget::isVisible((QWidget *)0x7d5a20), bVar1)) {
    QList<QWidget_*>::append((QList<QWidget_*> *)0x7d5a35,in_stack_ffffffffffffff98);
  }
  return (QWidgetList *)in_RDI;
}

Assistant:

QWidgetList QAccessibleAbstractScrollArea::accessibleChildren() const
{
    QWidgetList children;

    // Viewport.
    QWidget * viewport = abstractScrollArea()->viewport();
    if (viewport)
        children.append(viewport);

    // Horizontal scrollBar container.
    QScrollBar *horizontalScrollBar = abstractScrollArea()->horizontalScrollBar();
    if (horizontalScrollBar && horizontalScrollBar->isVisible()) {
        QWidget *scrollBarParent = horizontalScrollBar->parentWidget();
        // Add container only if scroll bar is in the container
        if (elementType(scrollBarParent) == HorizontalContainer)
            children.append(scrollBarParent);
    }

    // Vertical scrollBar container.
    QScrollBar *verticalScrollBar = abstractScrollArea()->verticalScrollBar();
    if (verticalScrollBar && verticalScrollBar->isVisible()) {
        QWidget *scrollBarParent = verticalScrollBar->parentWidget();
        // Add container only if scroll bar is in the container
        if (elementType(scrollBarParent) == VerticalContainer)
            children.append(scrollBarParent);
    }

    // CornerWidget.
    QWidget *cornerWidget = abstractScrollArea()->cornerWidget();
    if (cornerWidget && cornerWidget->isVisible())
        children.append(cornerWidget);

    return children;
}